

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

void __thiscall QFont::setFamilies(QFont *this,QStringList *families)

{
  compare_eq_result_container<QList<QString>,_QString> cVar1;
  QFont *in_RSI;
  long in_RDI;
  QList<QString> *in_stack_00000010;
  QList<QString> *in_stack_ffffffffffffffd8;
  
  if ((*(uint *)(in_RDI + 8) & 0x20000) != 0) {
    QExplicitlySharedDataPointer<QFontPrivate>::operator->
              ((QExplicitlySharedDataPointer<QFontPrivate> *)0x711c43);
    cVar1 = QList<QString>::operator==(families,in_stack_00000010);
    if (cVar1) {
      return;
    }
  }
  detach(in_RSI);
  QExplicitlySharedDataPointer<QFontPrivate>::operator->
            ((QExplicitlySharedDataPointer<QFontPrivate> *)0x711c7a);
  QList<QString>::operator=((QList<QString> *)in_RSI,in_stack_ffffffffffffffd8);
  *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 0x20000;
  return;
}

Assistant:

void QFont::setFamilies(const QStringList &families)
{
    if ((resolve_mask & QFont::FamiliesResolved) && d->request.families == families)
        return;
    detach();
    d->request.families = families;
    resolve_mask |= QFont::FamiliesResolved;
}